

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::dictRelese(dic *this,int dictidx)

{
  dictEntry **ppdVar1;
  dictEntry *pdVar2;
  ulong uVar3;
  reference pvVar4;
  bool bVar5;
  __normal_iterator<dict_*,_std::vector<dict,_std::allocator<dict>_>_> local_48;
  __normal_iterator<dict_*,_std::vector<dict,_std::allocator<dict>_>_> local_40;
  const_iterator local_38;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  dictEntry *tmp;
  dictEntry *fetch;
  dic *pdStack_10;
  int dictidx_local;
  dic *this_local;
  
  tmp = (dictEntry *)0x0;
  _i_1 = (dictEntry *)0x0;
  fetch._4_4_ = dictidx;
  pdStack_10 = this;
  for (local_2c = 0; uVar3 = (ulong)local_2c,
      pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)fetch._4_4_),
      uVar3 < pvVar4->ht[0].size; local_2c = local_2c + 1) {
    pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)fetch._4_4_);
    tmp = pvVar4->ht[0].table[local_2c];
    while (pdVar2 = tmp, tmp != (dictEntry *)0x0) {
      _i_1 = tmp;
      ppdVar1 = &tmp->next;
      bVar5 = tmp != (dictEntry *)0x0;
      tmp = *ppdVar1;
      if (bVar5) {
        operator_delete(pdVar2);
      }
      _i_1 = (dictEntry *)0x0;
    }
  }
  pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)fetch._4_4_);
  if (pvVar4->rehashidx != -1) {
    for (local_30 = 0; uVar3 = (ulong)local_30,
        pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)fetch._4_4_),
        uVar3 < pvVar4->ht[1].size; local_30 = local_30 + 1) {
      pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)fetch._4_4_);
      tmp = pvVar4->ht[1].table[local_30];
      while (pdVar2 = tmp, tmp != (dictEntry *)0x0) {
        _i_1 = tmp;
        ppdVar1 = &tmp->next;
        bVar5 = tmp != (dictEntry *)0x0;
        tmp = *ppdVar1;
        if (bVar5) {
          operator_delete(pdVar2);
        }
        _i_1 = (dictEntry *)0x0;
      }
    }
  }
  local_48._M_current = (dict *)std::vector<dict,_std::allocator<dict>_>::begin(&this->dc);
  local_40 = __gnu_cxx::__normal_iterator<dict_*,_std::vector<dict,_std::allocator<dict>_>_>::
             operator+(&local_48,(long)fetch._4_4_);
  __gnu_cxx::__normal_iterator<dict_const*,std::vector<dict,std::allocator<dict>>>::
  __normal_iterator<dict*>
            ((__normal_iterator<dict_const*,std::vector<dict,std::allocator<dict>>> *)&local_38,
             &local_40);
  std::vector<dict,_std::allocator<dict>_>::erase(&this->dc,local_38);
  return 1;
}

Assistant:

int dic::dictRelese(int dictidx){
    dictEntry *fetch=NULL;
    dictEntry *tmp=NULL;
    //relese ht
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  
    if(dc[dictidx].rehashidx!=-1){
        for(unsigned int i=0;i<dc[dictidx].ht[1].size;i++){
            fetch=dc[dictidx].ht[1].table[i];
            while(fetch!=NULL){
                tmp=fetch;
                fetch=fetch->next;
                delete tmp;
                tmp=NULL;
            }
        }  
    } 
    //delete database
    dc.erase(dc.begin()+dictidx);

    return 1;
}